

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPPacketBuilder::Init
          (RTCPPacketBuilder *this,size_t maxpacksize,double tsunit,void *cname,size_t cnamelen)

{
  int iVar1;
  size_t len;
  
  iVar1 = -0x2f;
  if (((this->init == false) && (iVar1 = -0x30, 599 < maxpacksize)) &&
     (iVar1 = -0x31, 0.0 <= tsunit)) {
    len = 0xff;
    if (cnamelen < 0xff) {
      len = cnamelen;
    }
    this->maxpacketsize = maxpacksize;
    this->timestampunit = tsunit;
    iVar1 = RTCPSDESInfo::SDESItem::SetString
                      ((this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems,
                       &(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].str,
                       &(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].length,
                       (uint8_t *)cname,len);
    if (-1 < iVar1) {
      ClearAllSourceFlags(this);
      this->interval_name = -1;
      this->interval_email = -1;
      this->interval_location = -1;
      this->interval_phone = -1;
      this->interval_tool = -1;
      this->interval_note = -1;
      this->sdesbuildcount = 0;
      (this->transmissiondelay).m_t = 0.0;
      this->firstpacket = true;
      this->processingsdes = false;
      this->init = true;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int RTCPPacketBuilder::Init(size_t maxpacksize,double tsunit,const void *cname,size_t cnamelen)
{
	if (init)
		return ERR_RTP_RTCPPACKETBUILDER_ALREADYINIT;
	if (maxpacksize < RTP_MINPACKETSIZE)
		return ERR_RTP_RTCPPACKETBUILDER_ILLEGALMAXPACKSIZE;
	if (tsunit < 0.0)
		return ERR_RTP_RTCPPACKETBUILDER_ILLEGALTIMESTAMPUNIT;

	if (cnamelen>255)
		cnamelen = 255;
	
	maxpacketsize = maxpacksize;
	timestampunit = tsunit;
	
	int status;
	
	if ((status = ownsdesinfo.SetCNAME((const uint8_t *)cname,cnamelen)) < 0)
		return status;
	
	ClearAllSourceFlags();
	
	interval_name = -1;
	interval_email = -1;
	interval_location = -1;
	interval_phone = -1;
	interval_tool = -1;
	interval_note = -1;

	sdesbuildcount = 0;
	transmissiondelay = RTPTime(0,0);

	firstpacket = true;
	processingsdes = false;
	init = true;
	return 0;
}